

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qgraphicsitem_p.h
# Opt level: O2

qreal __thiscall QGraphicsItemPrivate::calcEffectiveOpacity(QGraphicsItemPrivate *this)

{
  uint uVar1;
  qreal qVar2;
  
  qVar2 = this->opacity;
  uVar1 = *(uint *)&this->field_0x164;
  while( true ) {
    if (this->parent == (QGraphicsItem *)0x0) {
      return qVar2;
    }
    this = (this->parent->d_ptr).d;
    if ((*(uint *)&this->field_0x164 & 0x80) != 0 || (uVar1 & 0x40) != 0) break;
    qVar2 = qVar2 * this->opacity;
    uVar1 = *(uint *)&this->field_0x164;
  }
  return qVar2;
}

Assistant:

inline qreal calcEffectiveOpacity() const
    {
        qreal o = opacity;
        QGraphicsItem *p = parent;
        int myFlags = flags;
        while (p) {
            int parentFlags = p->d_ptr->flags;

            // If I have a parent, and I don't ignore my parent's opacity, and my
            // parent propagates to me, then combine my local opacity with my parent's
            // effective opacity into my effective opacity.
            if ((myFlags & QGraphicsItem::ItemIgnoresParentOpacity)
                || (parentFlags & QGraphicsItem::ItemDoesntPropagateOpacityToChildren)) {
                break;
            }

            o *= p->d_ptr->opacity;
            p = p->d_ptr->parent;
            myFlags = parentFlags;
        }
        return o;
    }